

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int balance(BtCursor *pCur)

{
  u8 *puVar1;
  void *__dest;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  u8 uVar6;
  ushort uVar7;
  u16 uVar8;
  u32 uVar9;
  MemPage *pPage;
  MemPage *pMVar10;
  BtShared *pBVar11;
  u8 *puVar12;
  uint *puVar13;
  PgHdr *pPVar14;
  Pgno nCell;
  u8 uVar15;
  u8 uVar16;
  undefined1 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  char cVar22;
  ushort uVar23;
  ushort uVar24;
  u16 uVar25;
  ushort uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  BtCursor *pBVar32;
  void *pvVar33;
  MemPage **ppMVar34;
  undefined1 *puVar35;
  long lVar36;
  ulong uVar37;
  MemPage *pMVar38;
  uint uVar39;
  long lVar40;
  MemPage *pMVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  MemPage **ppMVar45;
  int iVar46;
  int iVar47;
  ulong uVar48;
  MemPage *pMVar49;
  uint uVar50;
  ulong uVar51;
  MemPage **ppMVar52;
  uint uVar53;
  MemPage *pMVar54;
  u8 *puVar55;
  ulong uVar56;
  u8 *puVar57;
  uint uVar58;
  long lVar59;
  ulong uVar60;
  Pgno PVar61;
  Pgno nCell_00;
  MemPage *pMVar62;
  long in_FS_OFFSET;
  bool bVar63;
  u16 *szCell_1;
  MemPage *pRef;
  int rc;
  MemPage *pChild;
  u16 szCell;
  Pgno pgnoNew;
  MemPage *pNew;
  u8 *pCell;
  char local_288;
  uint *local_278;
  void *local_1e8;
  undefined1 local_1c8 [32];
  Pgno local_1a8;
  int local_1a4;
  char local_1a0 [8];
  u8 local_198 [16];
  undefined1 local_188 [80];
  undefined8 local_138;
  undefined1 *puStack_130;
  undefined8 local_128;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined4 local_108;
  uint local_fc;
  undefined8 local_f8;
  undefined1 *puStack_f0;
  undefined4 local_e8;
  int iStack_dc;
  MemPage *local_d8;
  undefined1 *puStack_d0;
  undefined4 local_c8;
  int iStack_bc;
  undefined8 local_b8;
  undefined1 *puStack_b0;
  undefined4 local_a8;
  long lStack_a0;
  undefined1 *local_98 [2];
  MemPage *local_88 [4];
  undefined1 *local_68;
  MemPage *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_198[8] = 0xaa;
  local_198[9] = 0xaa;
  local_198[10] = 0xaa;
  local_198[0xb] = 0xaa;
  local_198[0xc] = 0xaa;
  local_198[0] = 0xaa;
  local_198[1] = 0xaa;
  local_198[2] = 0xaa;
  local_198[3] = 0xaa;
  local_198[4] = 0xaa;
  local_198[5] = 0xaa;
  local_198[6] = 0xaa;
  local_198[7] = 0xaa;
  local_1e8 = (void *)0x0;
LAB_00156ba9:
  pPage = pCur->pPage;
  if (-1 < pPage->nFree) {
LAB_00156bb7:
    if (pPage->nOverflow == '\0') {
      iVar27 = pPage->nFree * 3;
      uVar9 = pCur->pBt->usableSize;
      iVar31 = uVar9 * 2;
      bVar63 = false;
      if (iVar27 == iVar31 || SBORROW4(iVar27,iVar31) != (int)(iVar27 + uVar9 * -2) < 0)
      goto LAB_0015708a;
    }
    cVar22 = pCur->iPage;
    lVar40 = (long)cVar22;
    if (lVar40 == 0) {
      if (pPage->nOverflow == '\0') {
        bVar63 = false;
        goto LAB_0015708a;
      }
      iVar27 = 0;
      bVar63 = true;
      for (pBVar32 = pCur->pBt->pCursor; pBVar32 != (BtCursor *)0x0; pBVar32 = pBVar32->pNext) {
        if (((pBVar32 != pCur) && (pBVar32->eState == '\0')) && (pBVar32->pPage == pCur->pPage)) {
          bVar63 = false;
          iVar27 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
          break;
        }
      }
      if (bVar63) {
        local_88[0]._0_4_ = 0xaaaaaaaa;
        local_188._0_8_ = (MemPage *)0x0;
        local_58[0] = (MemPage *)((ulong)local_58[0] & 0xffffffff00000000);
        pBVar11 = pPage->pBt;
        iVar27 = sqlite3PagerWrite(pPage->pDbPage);
        local_88[0] = (MemPage *)CONCAT44(local_88[0]._4_4_,iVar27);
        if (iVar27 == 0) {
          iVar27 = allocateBtreePage(pBVar11,(MemPage **)local_188,(Pgno *)local_58,pPage->pgno,'\0'
                                    );
          local_88[0] = (MemPage *)CONCAT44(local_88[0]._4_4_,iVar27);
          copyNodeContent(pPage,(MemPage *)local_188._0_8_,(int *)local_88);
          if (pBVar11->autoVacuum != '\0') {
            ptrmapPut(pBVar11,(Pgno)local_58[0],'\x05',pPage->pgno,(int *)local_88);
          }
        }
        uVar18 = local_188._0_8_;
        iVar27 = (int)local_88[0];
        if ((int)local_88[0] == 0) {
          memcpy((u16 *)(local_188._0_8_ + 0x1c),pPage->aiOvfl,(ulong)((uint)pPage->nOverflow * 2));
          memcpy((u8 **)(uVar18 + 0x28),pPage->apOvfl,(ulong)pPage->nOverflow << 3);
          *(u8 *)(uVar18 + 0xc) = pPage->nOverflow;
          zeroPage(pPage,**(u8 **)(uVar18 + 0x50) & 0xfffffff7);
          *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
               (Pgno)local_58[0] >> 0x18 | ((Pgno)local_58[0] & 0xff0000) >> 8 |
               ((Pgno)local_58[0] & 0xff00) << 8 | (Pgno)local_58[0] << 0x18;
          pCur->apPage[1] = (MemPage *)uVar18;
          iVar27 = 0;
        }
        else {
          pCur->apPage[1] = (MemPage *)0x0;
          if ((MemPage *)local_188._0_8_ != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(*(DbPage **)(local_188._0_8_ + 0x70));
          }
        }
        bVar63 = true;
        if (iVar27 == 0) {
          pCur->iPage = '\x01';
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          bVar63 = true;
          goto LAB_0015708a;
        }
      }
      else {
        bVar63 = false;
      }
      goto LAB_00157c92;
    }
    if ((int)pPage->pDbPage->nRef < 2) {
      pMVar10 = pCur->apPage[lVar40 + -1];
      uVar26 = pCur->aiIdx[lVar40 + -1];
      iVar27 = sqlite3PagerWrite(pMVar10->pDbPage);
      if ((iVar27 == 0) && (iVar27 = 0, pMVar10->nFree < 0)) {
        iVar27 = btreeComputeFreeSpace(pMVar10);
      }
      pvVar33 = local_1e8;
      if (iVar27 == 0) {
        if (((pPage->intKeyLeaf != '\0') && (pPage->nOverflow == '\x01')) &&
           ((pPage->aiOvfl[0] == pPage->nCell &&
            ((pMVar10->pgno != 1 && (pMVar10->nCell == uVar26)))))) {
          pBVar11 = pPage->pBt;
          local_88[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
          local_1c8._0_4_ = 0xaaaaaaaa;
          local_b8 = (undefined1 *)CONCAT44(local_b8._4_4_,0xaaaaaaaa);
          if (pPage->nCell == 0) {
            iVar27 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13379);
          }
          else {
            iVar27 = allocateBtreePage(pBVar11,local_88,(Pgno *)&local_b8,0,'\0');
            local_1c8._0_4_ = iVar27;
            if (iVar27 == 0) {
              local_58[0] = (MemPage *)pPage->apOvfl[0];
              uVar25 = (*pPage->xCellSize)(pPage,(u8 *)local_58[0]);
              pMVar49 = local_88[0];
              local_d8 = (MemPage *)CONCAT62(local_d8._2_6_,uVar25);
              local_128 = &DAT_aaaaaaaaaaaaaaaa;
              local_138 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
              local_188._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_188._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              zeroPage(local_88[0],0xd);
              local_188._0_4_ = 1;
              local_188._16_8_ = local_58;
              local_188._24_8_ = &local_d8;
              local_188._32_8_ = pPage->aDataEnd;
              local_138._0_4_ = 2;
              local_128._4_4_ = 0x7fffffff;
              local_188._8_8_ = pPage;
              iVar27 = rebuildPage((CellArray *)local_188,0,1,pMVar49);
              local_1c8._0_4_ = iVar27;
              if (iVar27 == 0) {
                pMVar49->nFree =
                     (pBVar11->usableSize - ((uint)(ushort)local_d8 + (uint)pMVar49->cellOffset)) +
                     -2;
                if (pBVar11->autoVacuum != '\0') {
                  ptrmapPut(pBVar11,(Pgno)local_b8,'\x05',pMVar10->pgno,(int *)local_1c8);
                  if (pMVar49->minLocal < (ushort)local_d8) {
                    ptrmapPutOvflPtr(pMVar49,pMVar49,&local_58[0]->isInit,(int *)local_1c8);
                  }
                }
                uVar60 = (ulong)(CONCAT11(pPage->aCellIdx[(ulong)pPage->nCell * 2 + -2],
                                          pPage->aCellIdx[(ulong)pPage->nCell * 2 + -1]) &
                                pPage->maskPage);
                uVar51 = 0;
                puVar12 = pPage->aData + uVar60;
                pMVar62 = (MemPage *)(pPage->aData + uVar60 + 2);
                do {
                  pMVar41 = pMVar62;
                  puVar57 = puVar12;
                  if (7 < uVar51) break;
                  uVar51 = uVar51 + 1;
                  puVar12 = puVar57 + 1;
                  pMVar62 = (MemPage *)&pMVar41->intKey;
                } while ((char)*puVar57 < '\0');
                lVar40 = 4;
                do {
                  uVar6 = *(u8 *)((long)&pMVar41[-1].xParseCell + 7);
                  local_58[0] = pMVar41;
                  local_198[lVar40] = uVar6;
                  lVar40 = lVar40 + 1;
                  if (-1 < (char)uVar6) break;
                  bVar63 = pMVar41 < (MemPage *)(puVar57 + 10);
                  pMVar41 = (MemPage *)&pMVar41->intKey;
                } while (bVar63);
                if (local_1c8._0_4_ == 0) {
                  iVar31 = insertCell(pMVar10,(uint)pMVar10->nCell,local_198,(int)lVar40,(u8 *)0x0,
                                      pPage->pgno);
                  local_1c8._0_4_ = iVar31;
                }
                *(Pgno *)(pMVar10->aData + (ulong)pMVar10->hdrOffset + 8) =
                     (Pgno)local_b8 >> 0x18 | ((Pgno)local_b8 & 0xff0000) >> 8 |
                     ((Pgno)local_b8 & 0xff00) << 8 | (Pgno)local_b8 << 0x18;
              }
              if (pMVar49 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar49->pDbPage);
              }
              if (iVar27 != 0) goto LAB_00157c60;
            }
            iVar27 = local_1c8._0_4_;
          }
          goto LAB_00157c60;
        }
        pvVar33 = pcache1Alloc(pCur->pBt->pageSize);
        local_1a4 = 0;
        local_58[2] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        local_58[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        local_58[1] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        local_88[0] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        local_88[1] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        local_88[2] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        local_88[3] = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_98[0] = &DAT_aaaaaaaaaaaaaaaa;
        local_98[1] = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = 0xaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_c8 = 0xaaaaaaaa;
        local_d8 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_e8 = 0xaaaaaaaa;
        local_f8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8 = 0xaaaaaaaa;
        local_108 = 0xaaaaaaaa;
        local_118 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a0[0] = '\0';
        local_1a0[1] = '\0';
        local_1a0[2] = '\0';
        local_1a0[3] = '\0';
        local_1a0[4] = 0;
        local_188._0_8_ = (MemPage *)0x0;
        local_188._8_8_ = (MemPage *)0x0;
        local_188._16_8_ = (MemPage **)0x0;
        local_188._24_8_ = (MemPage **)0x0;
        local_188._32_8_ = (u8 *)0x0;
        local_188._40_8_ = (u8 *)0x0;
        local_188._48_8_ = (u8 *)0x0;
        local_188._56_8_ = (u8 *)0x0;
        local_188._64_8_ = (u8 *)0x0;
        local_188._72_8_ = (u8 *)0x0;
        local_138._0_4_ = 0;
        local_138._4_4_ = 0;
        puStack_130 = (undefined1 *)0x0;
        local_128._0_4_ = 0;
        local_128._4_4_ = 0x7fffffff;
        if (pvVar33 != (void *)0x0) {
          uVar50 = pCur->hints & 1;
          uVar53 = (uint)pMVar10->nCell + (uint)pMVar10->nOverflow;
          iVar31 = 0;
          if (1 < uVar53) {
            uVar42 = (uint)uVar26;
            if (uVar42 == 0) {
              iVar31 = 0;
            }
            else if (uVar53 == uVar42) {
              iVar31 = uVar53 + uVar50 + -2;
            }
            else {
              iVar31 = uVar42 - 1;
            }
            uVar53 = 2 - uVar50;
          }
          uVar60 = (ulong)uVar53;
          uVar42 = (iVar31 - (uint)pMVar10->nOverflow) + uVar53;
          puVar12 = pMVar10->aData;
          if (uVar42 == pMVar10->nCell) {
            uVar51 = (ulong)pMVar10->hdrOffset + 8;
          }
          else {
            uVar51 = (ulong)(CONCAT11(pMVar10->aCellIdx[(long)(int)uVar42 * 2],
                                      pMVar10->aCellIdx[(long)(int)uVar42 * 2 + 1]) &
                            pMVar10->maskPage);
          }
          pBVar11 = pMVar10->pBt;
          uVar28 = uVar53 + 1;
          uVar42 = *(uint *)(puVar12 + uVar51);
          PVar61 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8 |
                   uVar42 << 0x18;
          uVar48 = (ulong)(uVar53 * 8);
          uVar42 = iVar31 + -1 + uVar53;
          iVar27 = (iVar31 + uVar53) * 2;
          local_278 = &local_fc + uVar60;
          iVar47 = 0;
          local_1a8 = PVar61;
          do {
            iVar27 = iVar27 + -2;
            if (local_1a4 == 0) {
              local_1a4 = getAndInitPage(pBVar11,PVar61,(MemPage **)((long)local_58 + uVar48),0);
            }
            if (local_1a4 != 0) {
              uVar48 = uVar48 + 8;
LAB_00157b90:
              uVar50 = 0;
              local_1a8 = PVar61;
              __memset_chk(local_58,0,uVar48,0x18);
              iVar47 = local_1a4;
              goto LAB_00157bc7;
            }
            if (((*(MemPage **)((long)local_58 + uVar48))->nFree < 0) &&
               (local_1a4 = btreeComputeFreeSpace(*(MemPage **)((long)local_58 + uVar48)),
               local_1a4 != 0)) goto LAB_00157b90;
            iVar46 = iVar47 + (uint)*(ushort *)(*(long *)((long)local_58 + uVar48) + 0x18);
            iVar47 = iVar46 + 4;
            if (uVar48 == 0) goto LAB_00157300;
            if ((pMVar10->nOverflow == 0) || (uVar42 != pMVar10->aiOvfl[0])) {
              puVar55 = pMVar10->aData;
              lVar40 = (long)(int)(iVar27 + (uint)pMVar10->nOverflow * -2);
              uVar23 = CONCAT11(pMVar10->aCellIdx[lVar40],pMVar10->aCellIdx[lVar40 + 1]) &
                       pMVar10->maskPage;
              puVar57 = puVar55 + uVar23;
              *(u8 **)((long)&lStack_a0 + uVar48) = puVar57;
              uVar58 = *(uint *)(puVar55 + uVar23);
              uVar25 = (*pMVar10->xCellSize)(pMVar10,puVar57);
              *local_278 = (uint)uVar25;
              if (((pBVar11->btsFlags & 0xc) != 0) &&
                 (iVar46 = (int)puVar57 - *(int *)&pMVar10->aData,
                 (int)(iVar46 + (uint)uVar25) <= (int)pBVar11->usableSize)) {
                memcpy((void *)((long)iVar46 + (long)pvVar33),puVar57,(ulong)(uint)uVar25);
                *(long *)((long)&lStack_a0 + uVar48) =
                     ((long)puVar57 - (long)pMVar10->aData) + (long)pvVar33;
              }
              PVar61 = uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                       uVar58 << 0x18;
              dropCell(pMVar10,uVar42 - pMVar10->nOverflow,(uint)uVar25,&local_1a4);
            }
            else {
              puVar13 = (uint *)pMVar10->apOvfl[0];
              *(uint **)((long)&lStack_a0 + uVar48) = puVar13;
              uVar58 = *puVar13;
              PVar61 = uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                       uVar58 << 0x18;
              uVar25 = (*pMVar10->xCellSize)(pMVar10,(u8 *)puVar13);
              *local_278 = (uint)uVar25;
              pMVar10->nOverflow = '\0';
            }
            uVar48 = uVar48 - 8;
            uVar42 = uVar42 - 1;
            local_278 = local_278 + -1;
          } while( true );
        }
        iVar27 = 7;
        goto LAB_00157c3e;
      }
      goto LAB_00157c60;
    }
    iVar27 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x137f9);
    goto LAB_00157c90;
  }
  iVar27 = btreeComputeFreeSpace(pPage);
  bVar63 = false;
  if (iVar27 == 0) goto LAB_00156bb7;
LAB_0015708a:
  iVar27 = 0;
  goto LAB_00157c92;
LAB_00157300:
  uVar42 = iVar46 + 7;
  uVar58 = uVar42 & 0x7ffffffc;
  local_1a8 = PVar61;
  ppMVar34 = (MemPage **)sqlite3Malloc((long)(int)(uVar58 * 10 + pBVar11->pageSize));
  local_188._16_8_ = ppMVar34;
  if (ppMVar34 == (MemPage **)0x0) {
    local_1a4 = 7;
    iVar27 = local_1a4;
LAB_00157bc4:
    local_1a4 = iVar27;
    uVar50 = 0;
    iVar47 = local_1a4;
  }
  else {
    ppMVar45 = ppMVar34 + uVar58;
    local_188._24_8_ = ppMVar45;
    local_188._8_8_ = local_58[0];
    bVar3 = local_58[0]->leaf;
    lVar40 = (ulong)bVar3 * 4;
    bVar4 = local_58[0]->intKeyLeaf;
    uVar48 = 0;
    iVar46 = 0;
    iVar47 = local_188._0_4_;
    do {
      pMVar49 = local_58[uVar48];
      puVar57 = pMVar49->aData;
      if (*puVar57 == *local_58[0]->aData) {
        uVar23 = pMVar49->nCell;
        uVar24 = pMVar49->maskPage;
        puVar55 = puVar57 + pMVar49->cellOffset;
        memset((void *)((long)ppMVar45 + (long)iVar47 * 2),0,
               (ulong)(((uint)uVar23 + (uint)pMVar49->nOverflow) * 2));
        bVar5 = pMVar49->nOverflow;
        if (bVar5 != 0) {
          uVar7 = pMVar49->aiOvfl[0];
          if (uVar23 < uVar7) {
            bVar63 = false;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13539);
            local_1a4 = 0xb;
            goto LAB_00157668;
          }
          if (uVar7 != 0) {
            lVar36 = 0;
            do {
              ppMVar34[iVar47 + lVar36] =
                   (MemPage *)(puVar57 + (uVar24 & CONCAT11(*puVar55,puVar55[1])));
              puVar55 = puVar55 + 2;
              lVar36 = lVar36 + 1;
            } while ((uint)uVar7 != (uint)lVar36);
            iVar47 = iVar47 + (uint)lVar36;
          }
          uVar39 = (uint)bVar5;
          if (bVar5 < 2) {
            uVar39 = 1;
          }
          uVar56 = 0;
          do {
            ppMVar34[(long)iVar47 + uVar56] = (MemPage *)pMVar49->apOvfl[uVar56];
            uVar56 = uVar56 + 1;
          } while (uVar39 != uVar56);
          iVar47 = iVar47 + (int)uVar56;
          local_188._0_8_ = (MemPage *)CONCAT44(SUB84(local_188._0_8_,4),iVar47);
        }
        uVar23 = pMVar49->cellOffset;
        uVar7 = pMVar49->nCell;
        if (puVar55 < puVar57 + (ulong)uVar7 * 2 + (ulong)uVar23) {
          lVar36 = (long)iVar47;
          lVar59 = 0;
          do {
            puVar1 = puVar55 + lVar59;
            *(u8 **)((long)ppMVar34 + lVar59 * 4 + lVar36 * 8) =
                 puVar57 + (CONCAT11(*puVar1,puVar1[1]) & uVar24);
            iVar47 = iVar47 + 1;
            local_188._0_4_ = iVar47;
            lVar59 = lVar59 + 2;
          } while (puVar1 + 2 < puVar57 + (ulong)uVar7 * 2 + (ulong)uVar23);
        }
        *(int *)((long)&local_d8 + uVar48 * 4) = iVar47;
        if ((uVar48 < uVar60) && (bVar4 == 0)) {
          uVar39 = *(uint *)((long)&local_f8 + uVar48 * 4);
          uVar43 = uVar39 & 0xffff;
          lVar36 = (long)iVar47;
          *(short *)((long)ppMVar45 + lVar36 * 2) = (short)uVar39;
          __dest = (void *)((long)ppMVar45 + (long)iVar46 + (ulong)uVar58 * 2);
          iVar46 = iVar46 + uVar43;
          memcpy(__dest,local_98[uVar48],(ulong)uVar43);
          pMVar62 = (MemPage *)((long)__dest + lVar40);
          ppMVar34[lVar36] = pMVar62;
          uVar23 = *(short *)((long)ppMVar45 + lVar36 * 2) - (ushort)lVar40;
          *(ushort *)((long)ppMVar45 + lVar36 * 2) = uVar23;
          if (pMVar49->leaf == '\0') {
            puVar57 = pMVar49->aData;
            uVar6 = puVar57[9];
            uVar15 = puVar57[10];
            uVar16 = puVar57[0xb];
            pMVar62->isInit = puVar57[8];
            pMVar62->intKey = uVar6;
            pMVar62->intKeyLeaf = uVar15;
            pMVar62->field_0x3 = uVar16;
          }
          else if (uVar23 < 4) {
            puVar35 = (undefined1 *)
                      ((long)ppMVar34 + (long)iVar46 + (ulong)(uVar42 >> 2 & 0x1fffffff) * 0x28);
            do {
              *puVar35 = 0;
              uVar23 = *(short *)((long)ppMVar45 + lVar36 * 2) + 1;
              *(ushort *)((long)ppMVar45 + lVar36 * 2) = uVar23;
              puVar35 = puVar35 + 1;
              iVar46 = iVar46 + 1;
            } while (uVar23 < 4);
          }
          iVar47 = iVar47 + 1;
          local_188._0_4_ = iVar47;
        }
        bVar63 = true;
      }
      else {
        bVar63 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13521);
        local_1a4 = 0xb;
      }
LAB_00157668:
      iVar27 = local_1a4;
      if (!bVar63) goto LAB_00157bc4;
      uVar48 = uVar48 + 1;
    } while (uVar48 != uVar28);
    iVar46 = pBVar11->usableSize + (uint)(ushort)lVar40 + -0xc;
    uVar48 = 0;
    pMVar49 = (MemPage *)0x0;
    do {
      pMVar62 = local_58[uVar48];
      iVar30 = (int)pMVar49;
      lVar36 = (long)iVar30;
      *(u8 **)(local_188 + lVar36 * 8 + 0x20) = pMVar62->aDataEnd;
      iVar27 = *(int *)((long)&local_d8 + uVar48 * 4);
      *(int *)((long)&local_138 + lVar36 * 4) = iVar27;
      iVar47 = 0;
      if ((iVar30 != 0) && (iVar47 = iVar30 + -1, iVar27 != *(int *)(local_188 + lVar36 * 4 + 0x4c))
         ) {
        iVar47 = iVar30;
      }
      if (bVar4 == 0) {
        lVar36 = (long)iVar47;
        iVar47 = iVar47 + 1;
        *(u8 **)(local_188 + lVar36 * 8 + 0x28) = pMVar10->aDataEnd;
        *(int *)((long)&local_138 + lVar36 * 4 + 4) = iVar27 + 1;
      }
      *(int *)((long)&local_f8 + uVar48 * 4) = iVar46 - pMVar62->nFree;
      if (pMVar62->nOverflow != '\0') {
        uVar56 = 0;
        do {
          uVar25 = (*pMVar62->xCellSize)(pMVar62,pMVar62->apOvfl[uVar56]);
          *(uint *)((long)&local_f8 + uVar48 * 4) =
               (uint)uVar25 + *(int *)((long)&local_f8 + uVar48 * 4) + 2;
          uVar56 = uVar56 + 1;
        } while (uVar56 < pMVar62->nOverflow);
      }
      uVar20 = local_188._24_8_;
      uVar18 = local_188._0_8_;
      *(int *)((long)&local_b8 + uVar48 * 4) = iVar27;
      uVar48 = uVar48 + 1;
      pMVar49 = (MemPage *)(ulong)(iVar47 + 1);
    } while (uVar48 != uVar28);
    uVar19 = local_188._0_4_;
    lVar36 = (long)(int)local_188._0_4_;
    uVar56 = 0;
    uVar48 = (ulong)uVar28;
    iVar27 = local_1a4;
    do {
      iVar47 = *(int *)((long)&local_f8 + uVar56 * 4);
      if (iVar46 < iVar47) {
        uVar42 = (int)uVar56 + 2;
        do {
          if ((long)(int)uVar48 <= (long)(uVar56 + 1)) {
            if (3 < uVar56) {
              *(int *)((long)&local_f8 + uVar56 * 4) = iVar47;
              bVar63 = false;
              iVar27 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1359e);
              uVar48 = (ulong)uVar42;
              goto LAB_001579ee;
            }
            *(undefined4 *)((long)&local_f8 + uVar56 * 4 + 4) = 0;
            *(undefined4 *)((long)&local_b8 + uVar56 * 4 + 4) = uVar19;
            uVar48 = (ulong)uVar42;
          }
          iVar30 = *(int *)((long)&local_b8 + uVar56 * 4);
          pMVar49 = (MemPage *)(long)iVar30;
          uVar23 = *(ushort *)(uVar20 + (long)pMVar49 * 2 + -2);
          if (uVar23 == 0) {
            uVar23 = computeCellSize((CellArray *)local_188,iVar30 + -1);
          }
          iVar29 = uVar23 + 2;
          if ((bVar4 == 0) && (iVar29 = 0, iVar30 < (int)uVar19)) {
            uVar24 = *(ushort *)(uVar20 + (long)pMVar49 * 2);
            if (uVar24 == 0) {
              uVar24 = computeCellSize((CellArray *)local_188,iVar30);
            }
            iVar29 = uVar24 + 2;
          }
          piVar2 = (int *)((long)&local_f8 + uVar56 * 4 + 4);
          *piVar2 = *piVar2 + iVar29;
          iVar47 = iVar47 - (uVar23 + 2);
          *(int *)((long)&local_b8 + uVar56 * 4) = iVar30 + -1;
        } while (iVar46 < iVar47);
      }
      *(int *)((long)&local_f8 + uVar56 * 4) = iVar47;
      uVar42 = *(uint *)((long)&local_b8 + uVar56 * 4);
      pMVar49 = (MemPage *)(ulong)uVar42;
      if ((int)uVar42 < (int)uVar19) {
        lVar59 = (long)(int)uVar42;
        do {
          lVar59 = lVar59 + 1;
          uVar23 = *(ushort *)(uVar20 + lVar59 * 2 + -2);
          iVar47 = (int)pMVar49;
          if (uVar23 == 0) {
            uVar23 = computeCellSize((CellArray *)local_188,iVar47);
          }
          iVar30 = uVar23 + 2;
          iVar29 = *(int *)((long)&local_f8 + uVar56 * 4) + iVar30;
          if (iVar46 < iVar29) goto LAB_00157948;
          pMVar49 = (MemPage *)(ulong)(iVar47 + 1U);
          *(int *)((long)&local_f8 + uVar56 * 4) = iVar29;
          *(uint *)((long)&local_b8 + uVar56 * 4) = iVar47 + 1U;
          if ((bVar4 == 0) && (iVar30 = 0, lVar59 < lVar36)) {
            uVar23 = *(ushort *)(uVar20 + lVar59 * 2);
            if (uVar23 == 0) {
              uVar23 = computeCellSize((CellArray *)local_188,iVar47 + 1);
            }
            iVar30 = uVar23 + 2;
          }
          piVar2 = (int *)((long)&local_f8 + uVar56 * 4 + 4);
          *piVar2 = *piVar2 - iVar30;
        } while (lVar59 != lVar36);
        pMVar49 = (MemPage *)(uVar18 & 0xffffffff);
      }
LAB_00157948:
      if ((int)pMVar49 < (int)uVar19) {
        if (uVar56 == 0) {
          iVar47 = 0;
        }
        else {
          iVar47 = (&iStack_bc)[uVar56];
        }
        bVar63 = true;
        if ((int)pMVar49 <= iVar47) {
          bVar63 = false;
          iVar27 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x135bf);
        }
      }
      else {
        uVar48 = (ulong)((int)uVar56 + 1);
        bVar63 = true;
      }
LAB_001579ee:
      if (!bVar63) goto LAB_00157bc4;
      uVar56 = uVar56 + 1;
      iVar47 = (int)uVar48;
    } while ((long)uVar56 < (long)iVar47);
    uVar56 = (ulong)(iVar47 - 1);
    local_1a4 = iVar27;
    do {
      local_288 = (char)uVar50;
      if ((int)uVar56 < 1) {
        bVar5 = *local_58[0]->aData;
        if (0 < iVar47) {
          uVar56 = 0;
          uVar42 = 0;
          goto LAB_00157cd8;
        }
        uVar50 = 0;
        goto LAB_001580f7;
      }
      uVar42 = (&local_fc)[uVar56];
      iVar27 = *(int *)((long)&local_f8 + uVar56 * 4);
      iVar30 = (&iStack_bc)[uVar56];
      pMVar49 = (MemPage *)((long)iVar30 - (ulong)bVar4);
      if (*(short *)(uVar20 + (long)pMVar49 * 2) == 0) {
        computeCellSize((CellArray *)local_188,(int)pMVar49);
      }
      uVar37 = uVar56 - 1;
      iVar30 = iVar30 + -1;
      do {
        uVar23 = *(ushort *)(uVar20 + (long)iVar30 * 2);
        if (uVar23 == 0) {
          uVar23 = computeCellSize((CellArray *)local_188,iVar30);
        }
        uVar58 = (uint)*(ushort *)(uVar20 + (long)(int)pMVar49 * 2);
        if ((iVar27 == 0) ||
           ((local_288 == '\0' &&
            ((int)(uVar58 + iVar27 + 2) <=
             (int)((uVar42 + (uint)(uVar56 == iVar47 - 1) * 2 + -2) - (uint)uVar23))))) {
          iVar27 = iVar27 + uVar58 + 2;
          uVar42 = (uVar42 - uVar23) - 2;
          *(int *)((long)&local_b8 + uVar37 * 4) = iVar30;
          iVar30 = iVar30 + -1;
          pMVar49 = (MemPage *)(ulong)((int)pMVar49 - 1);
          bVar63 = true;
        }
        else {
          bVar63 = false;
        }
      } while ((bVar63) && (-1 < iVar30));
      *(int *)((long)&local_f8 + uVar56 * 4) = iVar27;
      *(uint *)((long)&local_f8 + uVar37 * 4) = uVar42;
      iVar27 = 0;
      if (uVar56 != 1) {
        iVar27 = *(int *)((long)&local_b8 + (ulong)((int)uVar56 - 2) * 4);
      }
      uVar56 = uVar37;
    } while (iVar27 < *(int *)((long)&local_b8 + uVar37 * 4));
    uVar50 = 0;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x135eb);
    local_1a4 = 0xb;
    iVar47 = local_1a4;
  }
  goto LAB_00157bc7;
  while (uVar56 = uVar56 + 1, uVar42 = uVar50, uVar48 != uVar56) {
LAB_00157cd8:
    local_1c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if (uVar60 < uVar56) {
      PVar61 = 1;
      if (local_288 == '\0') {
        PVar61 = local_1a8;
      }
      pMVar49 = (MemPage *)0x0;
      local_1a4 = allocateBtreePage(pBVar11,(MemPage **)local_1c8,&local_1a8,PVar61,'\0');
      uVar18 = local_1c8._0_8_;
      uVar50 = uVar42;
      if (local_1a4 == 0) {
        zeroPage((MemPage *)local_1c8._0_8_,(uint)bVar5);
        local_88[uVar56] = (MemPage *)uVar18;
        uVar50 = uVar42 + 1;
        *(undefined4 *)((long)&local_d8 + uVar56 * 4) = uVar19;
        if ((pBVar11->autoVacuum == '\0') ||
           (ptrmapPut(pBVar11,*(Pgno *)(uVar18 + 4),'\x05',pMVar10->pgno,&local_1a4), local_1a4 == 0
           )) goto LAB_00157e42;
      }
      pMVar49 = (MemPage *)0x0;
    }
    else {
      pMVar62 = local_58[uVar56];
      local_88[uVar56] = pMVar62;
      local_58[uVar56] = (MemPage *)0x0;
      local_1c8._0_8_ = pMVar62;
      local_1a4 = sqlite3PagerWrite(pMVar62->pDbPage);
      if ((((uint)uVar26 - iVar31 == uVar56) + 1 != (int)pMVar62->pDbPage->nRef) && (local_1a4 == 0)
         ) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
        local_1a4 = 0xb;
      }
      uVar50 = uVar42 + 1;
      if (local_1a4 == 0) {
LAB_00157e42:
        uVar50 = uVar42 + 1;
        pMVar49 = (MemPage *)CONCAT71((int7)((ulong)pMVar49 >> 8),1);
      }
      else {
        pMVar49 = (MemPage *)0x0;
      }
    }
    iVar47 = local_1a4;
    if ((char)pMVar49 == '\0') goto LAB_00157bc7;
  }
LAB_001580f7:
  if (0 < (int)uVar50) {
    uVar48 = 0;
    do {
      *(Pgno *)((long)&local_118 + uVar48 * 4) = local_88[uVar48]->pgno;
      uVar48 = uVar48 + 1;
    } while (uVar50 != uVar48);
  }
  uVar42 = uVar50 - 1;
  if (1 < (int)uVar50) {
    uVar48 = 1;
    uVar56 = 0;
    do {
      uVar44 = uVar56 & 0xffffffff;
      uVar37 = uVar48;
      do {
        uVar58 = (uint)uVar37;
        if (local_88[(int)(uint)uVar44]->pgno <= local_88[uVar37]->pgno) {
          uVar58 = (uint)uVar44;
        }
        uVar37 = uVar37 + 1;
        uVar44 = (ulong)uVar58;
      } while (uVar50 != uVar37);
      if (uVar56 != uVar58) {
        pMVar62 = local_88[uVar56];
        uVar39 = pMVar62->pgno;
        pMVar49 = (MemPage *)(ulong)uVar39;
        pMVar41 = local_88[(int)uVar58];
        PVar61 = pMVar41->pgno;
        uVar58 = (uint)sqlite3PendingByte / pBVar11->pageSize;
        pPVar14 = pMVar62->pDbPage;
        uVar25 = pPVar14->flags;
        uVar8 = pMVar41->pDbPage->flags;
        pPVar14->flags = uVar8;
        sqlite3PcacheMove(pPVar14,uVar58 + 1);
        pPVar14 = pMVar41->pDbPage;
        pPVar14->flags = uVar25;
        sqlite3PcacheMove(pPVar14,uVar39);
        pPVar14 = pMVar62->pDbPage;
        pPVar14->flags = uVar8;
        sqlite3PcacheMove(pPVar14,PVar61);
        pMVar62->pgno = PVar61;
        pMVar41->pgno = uVar39;
      }
      uVar56 = uVar56 + 1;
      uVar48 = uVar48 + 1;
    } while (uVar56 != uVar42);
  }
  pMVar62 = local_88[(int)uVar42];
  uVar58 = pMVar62->pgno;
  *(uint *)(puVar12 + uVar51) =
       uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 | uVar58 << 0x18;
  if (((bVar5 & 8) == 0) && (uVar28 != uVar50)) {
    ppMVar34 = local_58;
    if ((int)uVar28 < (int)uVar50) {
      ppMVar34 = local_88;
    }
    *(undefined4 *)(pMVar62->aData + 8) = *(undefined4 *)(ppMVar34[uVar60]->aData + 8);
  }
  if (pBVar11->autoVacuum != '\0') {
    if (0 < (int)uVar19) {
      pMVar38 = (MemPage *)(ulong)((uint)local_88[0]->nCell + (uint)local_88[0]->nOverflow);
      pMVar49 = (MemPage *)0x0;
      iVar47 = 0;
      iVar27 = 0;
      pMVar41 = local_88[0];
      pMVar62 = local_88[0];
      do {
        if (pMVar49 == pMVar38) {
          lVar36 = (long)iVar47;
          ppMVar34 = local_58 + lVar36 + 1;
          ppMVar45 = local_88 + lVar36 + 1;
          do {
            lVar36 = lVar36 + 1;
            ppMVar52 = ppMVar34;
            if (lVar36 < (int)uVar50) {
              ppMVar52 = ppMVar45;
            }
            pMVar62 = *ppMVar52;
            pMVar38 = (MemPage *)
                      (ulong)((int)pMVar38 + (uint)(bVar4 == 0) + (uint)pMVar62->nCell +
                             (uint)pMVar62->nOverflow);
            iVar47 = iVar47 + 1;
            ppMVar34 = ppMVar34 + 1;
            ppMVar45 = ppMVar45 + 1;
          } while (pMVar49 == pMVar38);
        }
        pMVar54 = *(MemPage **)(local_188._16_8_ + pMVar49 * 8);
        lVar36 = (long)iVar27;
        if (pMVar49 == (MemPage *)(ulong)*(uint *)((long)&local_b8 + lVar36 * 4)) {
          iVar27 = iVar27 + 1;
          pMVar41 = local_88[lVar36 + 1];
          if (bVar4 != 0) goto LAB_0015836c;
          iVar30 = 0x32;
        }
        else {
LAB_0015836c:
          if (((((int)uVar50 <= iVar47) ||
               (pMVar41->pgno != *(Pgno *)((long)&local_118 + (long)iVar47 * 4))) ||
              (pMVar54 < (MemPage *)pMVar62->aData)) ||
             (iVar30 = 0, (MemPage *)pMVar62->aDataEnd <= pMVar54)) {
            if (bVar3 == 0) {
              uVar58._0_1_ = pMVar54->isInit;
              uVar58._1_1_ = pMVar54->intKey;
              uVar58._2_1_ = pMVar54->intKeyLeaf;
              uVar58._3_1_ = pMVar54->field_0x3;
              ptrmapPut(pBVar11,uVar58 >> 0x18 | (uVar58 & 0xff0000) >> 8 | (uVar58 & 0xff00) << 8 |
                                uVar58 << 0x18,'\x05',pMVar41->pgno,&local_1a4);
            }
            uVar26 = *(ushort *)(local_188._24_8_ + (long)pMVar49 * 2);
            if (uVar26 == 0) {
              uVar26 = computeCellSize((CellArray *)local_188,(int)pMVar49);
            }
            if (pMVar41->minLocal < uVar26) {
              ptrmapPutOvflPtr(pMVar41,pMVar62,&pMVar54->isInit,&local_1a4);
            }
            iVar30 = (uint)(local_1a4 != 0) << 2;
          }
        }
        if ((iVar30 != 0x32) && (iVar30 != 0)) goto LAB_00158458;
        pMVar49 = (MemPage *)&pMVar49->intKey;
      } while ((long)pMVar49 < (long)(int)local_188._0_4_);
    }
    iVar30 = 0;
LAB_00158458:
    iVar47 = local_1a4;
    if (iVar30 == 4) goto LAB_00157bc7;
    iVar27 = (int)pMVar49;
    if (iVar30 != 0) goto LAB_00157c3e;
  }
  uVar20 = local_188._24_8_;
  uVar18 = local_188._16_8_;
  iVar47 = local_1a4;
  if (1 < (int)uVar50) {
    uVar60 = 0;
    iVar30 = 0;
    iVar27 = local_1a4;
    do {
      pMVar62 = local_88[uVar60];
      iVar47 = *(int *)((long)&local_b8 + uVar60 * 4);
      lVar36 = (long)iVar47;
      pMVar41 = *(MemPage **)(uVar18 + lVar36 * 8);
      uVar26 = *(ushort *)(uVar20 + lVar36 * 2);
      pMVar49 = (MemPage *)(ulong)((uint)uVar26 + (int)lVar40);
      pMVar54 = (MemPage *)((long)iVar30 + (long)pvVar33);
      pMVar38 = pMVar54;
      if (pMVar62->leaf == '\0') {
        puVar12 = pMVar62->aData;
        uVar6 = pMVar41->intKey;
        uVar15 = pMVar41->intKeyLeaf;
        uVar17 = pMVar41->field_0x3;
        puVar12[8] = pMVar41->isInit;
        puVar12[9] = uVar6;
        puVar12[10] = uVar15;
        puVar12[0xb] = uVar17;
      }
      else if (bVar4 == 0) {
        pMVar41 = (MemPage *)((long)&pMVar41[-1].xParseCell + 4);
        if (uVar26 == 4) {
          uVar25 = (*pMVar10->xCellSize)(pMVar10,(u8 *)pMVar41);
          pMVar49 = (MemPage *)(ulong)uVar25;
        }
      }
      else {
        local_1c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        iVar47 = iVar47 + -1;
        (*pMVar62->xParseCell)
                  (pMVar62,&(*(MemPage **)(uVar18 + (lVar36 + -1) * 8))->isInit,
                   (CellInfo *)local_1c8);
        iVar29 = sqlite3PutVarint((uchar *)&pMVar54->pgno,local_1c8._0_8_);
        pMVar49 = (MemPage *)(ulong)(iVar29 + 4);
        pMVar38 = (MemPage *)0x0;
        pMVar41 = pMVar54;
      }
      lVar36 = 0;
      do {
        lVar59 = lVar36 + 4;
        piVar2 = (int *)((long)&local_138 + lVar36);
        lVar36 = lVar59;
      } while (*piVar2 <= iVar47);
      iVar29 = (int)pMVar49;
      if ((pMVar41 < *(MemPage **)(local_188 + lVar59 * 2 + 0x18)) &&
         (*(MemPage **)(local_188 + lVar59 * 2 + 0x18) <
          (MemPage *)((long)pMVar41->aiOvfl + (long)iVar29 + -0x1c))) {
        local_1a4 = iVar27;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x136d5);
        local_1a4 = 0xb;
        iVar47 = local_1a4;
        goto LAB_00157bc7;
      }
      iVar47 = insertCell(pMVar10,iVar31 + (int)uVar60,&pMVar41->isInit,iVar29,&pMVar38->isInit,
                          pMVar62->pgno);
      if (iVar47 != 0) goto LAB_00157bc7;
      iVar30 = iVar30 + iVar29;
      uVar60 = uVar60 + 1;
      iVar27 = 0;
    } while (uVar60 != uVar42);
  }
  uVar21 = local_188._24_8_;
  uVar20 = local_188._16_8_;
  uVar18 = local_188._8_8_;
  uVar42 = 1 - uVar50;
  if ((int)uVar42 < (int)uVar50) {
    uVar19 = local_188._0_4_;
    PVar61 = (Pgno)local_b8;
    local_1a4 = iVar47;
    do {
      uVar58 = -uVar42;
      if (0 < (int)uVar42) {
        uVar58 = uVar42;
      }
      uVar60 = (ulong)uVar58;
      iVar31 = 0x3d;
      if ((local_1a0[uVar60] == '\0') &&
         ((-1 < (int)uVar42 || (iVar31 = 0, (&iStack_bc)[(int)uVar58] <= (&iStack_dc)[(int)uVar58]))
         )) {
        if (uVar42 == 0) {
          iVar31 = 0;
          iVar27 = 0;
          nCell = PVar61;
        }
        else {
          iVar27 = uVar19;
          if (uVar58 <= uVar53) {
            iVar27 = (&iStack_dc)[(int)uVar58] + (uint)(bVar4 == 0);
          }
          iVar31 = (&iStack_bc)[(int)uVar58] + (uint)(bVar4 == 0);
          nCell = *(int *)((long)&local_b8 + uVar60 * 4) - iVar31;
        }
        pMVar62 = local_88[uVar60];
        puVar12 = pMVar62->aData;
        uVar51 = (ulong)pMVar62->hdrOffset;
        pMVar38 = (MemPage *)(pMVar62->aCellIdx + (int)(nCell * 2));
        uVar26 = pMVar62->nCell;
        local_1c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        bVar5 = pMVar62->nOverflow;
        uVar58 = (uint)uVar26;
        pMVar41 = (MemPage *)(ulong)uVar58;
        if (iVar27 < iVar31) {
          iVar30 = pageFreeArray(pMVar62,iVar27,iVar31 - iVar27,(CellArray *)local_188);
          pMVar41 = (MemPage *)(ulong)(uVar58 - iVar30);
          if ((int)uVar58 < iVar30) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13307,
                        "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
            pMVar41 = (MemPage *)(ulong)uVar26;
          }
          else {
            memmove(pMVar62->aCellIdx,pMVar62->aCellIdx + iVar30 * 2,(ulong)((uint)uVar26 * 2));
          }
          iVar47 = 0xb;
          pMVar49 = (MemPage *)(ulong)uVar26;
          if (iVar30 <= (int)(uint)uVar26) goto LAB_0015882a;
        }
        else {
LAB_0015882a:
          iVar47 = (uint)uVar26 + iVar27 + (uint)bVar5;
          iVar29 = nCell + iVar31;
          iVar30 = iVar47 - iVar29;
          if (iVar30 != 0 && iVar29 <= iVar47) {
            iVar47 = pageFreeArray(pMVar62,iVar29,iVar30,(CellArray *)local_188);
            pMVar41 = (MemPage *)(ulong)(uint)((int)pMVar41 - iVar47);
          }
          local_1c8._0_8_ =
               puVar12 + (ushort)(*(ushort *)(puVar12 + uVar51 + 5) << 8 |
                                 *(ushort *)(puVar12 + uVar51 + 5) >> 8);
          pMVar49 = pMVar62;
          if ((pMVar38 <= (ulong)local_1c8._0_8_) &&
             ((ulong)local_1c8._0_8_ <= (MemPage *)pMVar62->aDataEnd)) {
            if (iVar31 < iVar27) {
              nCell_00 = iVar27 - iVar31;
              if ((int)nCell <= iVar27 - iVar31) {
                nCell_00 = nCell;
              }
              puVar57 = pMVar62->aCellIdx;
              memmove(puVar57 + (int)(nCell_00 * 2),puVar57,(long)((int)pMVar41 * 2));
              iVar47 = pageInsertArray(pMVar62,(u8 *)pMVar38,(u8 **)local_1c8,puVar57,iVar31,
                                       nCell_00,(CellArray *)local_188);
              if (iVar47 != 0) goto LAB_00158a3f;
              pMVar41 = (MemPage *)(ulong)(nCell_00 + (int)pMVar41);
            }
            iVar47 = (int)pMVar41;
            if (pMVar62->nOverflow != '\0') {
              uVar48 = 0;
              do {
                lVar40 = (long)iVar27 + (ulong)pMVar62->aiOvfl[uVar48];
                iVar30 = (int)lVar40;
                iVar47 = iVar30 - iVar31;
                bVar63 = true;
                if ((-1 < iVar47) && (iVar47 < (int)nCell)) {
                  puVar57 = pMVar62->aCellIdx + (uint)(iVar47 * 2);
                  iVar29 = (int)pMVar41;
                  if (iVar29 - iVar47 != 0 && iVar47 <= iVar29) {
                    memmove(puVar57 + 2,puVar57,(long)((iVar29 - iVar47) * 2));
                  }
                  if (*(short *)(uVar21 + lVar40 * 2) == 0) {
                    computeCellSize((CellArray *)local_188,iVar30);
                  }
                  pMVar41 = (MemPage *)(ulong)(iVar29 + 1);
                  iVar47 = pageInsertArray(pMVar62,(u8 *)pMVar38,(u8 **)local_1c8,puVar57,iVar30,1,
                                           (CellArray *)local_188);
                  bVar63 = iVar47 == 0;
                }
                iVar47 = (int)pMVar41;
                if (!bVar63) goto LAB_00158a3f;
                uVar48 = uVar48 + 1;
              } while (uVar48 < pMVar62->nOverflow);
            }
            iVar27 = pageInsertArray(pMVar62,(u8 *)pMVar38,(u8 **)local_1c8,
                                     pMVar62->aCellIdx + iVar47 * 2,iVar47 + iVar31,nCell - iVar47,
                                     (CellArray *)local_188);
            if (iVar27 == 0) {
              pMVar62->nCell = (u16)nCell;
              pMVar62->nOverflow = '\0';
              puVar12[uVar51 + 3] = (u8)(nCell >> 8);
              puVar12[uVar51 + 4] = (u8)pMVar62->nCell;
              uVar26 = (short)local_1c8._0_8_ - (short)puVar12;
              *(ushort *)(puVar12 + uVar51 + 5) = uVar26 * 0x100 | uVar26 >> 8;
              iVar47 = 0;
              goto LAB_00158ad4;
            }
          }
LAB_00158a3f:
          if ((int)nCell < 1) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13351);
            iVar47 = 0xb;
          }
          else {
            lVar40 = (long)iVar31 * 2;
            pMVar49 = (MemPage *)(ulong)(nCell + 1);
            do {
              if (*(short *)(uVar21 + lVar40) == 0) {
                uVar25 = (**(_func_u16_MemPage_ptr_u8_ptr **)(uVar18 + 0x78))
                                   ((MemPage *)uVar18,*(u8 **)(uVar20 + lVar40 * 4));
                *(u16 *)(uVar21 + lVar40) = uVar25;
              }
              lVar40 = lVar40 + 2;
              uVar58 = (int)pMVar49 - 1;
              pMVar49 = (MemPage *)(ulong)uVar58;
            } while (1 < (int)uVar58);
            iVar47 = rebuildPage((CellArray *)local_188,iVar31,nCell,pMVar62);
          }
        }
LAB_00158ad4:
        iVar31 = 4;
        if (iVar47 == 0) {
          local_1a0[uVar60] = '\x01';
          pMVar62->nFree = iVar46 - *(int *)((long)&local_f8 + uVar60 * 4);
          iVar31 = 0;
        }
      }
      if ((iVar31 != 0) && (iVar31 != 0x3d)) {
        iVar27 = (int)pMVar49;
        local_1a4 = iVar47;
        if (iVar31 == 4) goto LAB_00157bc7;
        goto LAB_00157c3e;
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 != uVar50);
  }
  pMVar49 = local_88[0];
  local_1a4 = iVar47;
  if (((cVar22 == '\x01') && (pMVar10->nCell == 0)) &&
     ((int)(uint)pMVar10->hdrOffset <= local_88[0]->nFree)) {
    local_1a4 = defragmentPage(local_88[0],-1);
    copyNodeContent(pMVar49,pMVar10,&local_1a4);
    if (local_1a4 == 0) {
      local_1a4 = freePage2(pMVar49->pBt,pMVar49,pMVar49->pgno);
    }
  }
  else if (((0 < (int)uVar50) && (pBVar11->autoVacuum != '\0')) && (bVar3 == 0)) {
    uVar60 = 0;
    do {
      uVar42 = *(uint *)(local_88[uVar60]->aData + 8);
      ptrmapPut(pBVar11,uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8 |
                        uVar42 << 0x18,'\x05',local_88[uVar60]->pgno,&local_1a4);
      uVar60 = uVar60 + 1;
    } while (uVar50 != uVar60);
  }
  iVar47 = local_1a4;
  if ((int)uVar50 <= (int)uVar53) {
    lVar40 = 0;
    do {
      if (iVar47 == 0) {
        pMVar10 = local_58[(int)uVar50 + lVar40];
        iVar47 = freePage2(pMVar10->pBt,pMVar10,pMVar10->pgno);
      }
      lVar40 = lVar40 + 1;
    } while ((uVar53 - uVar50) + 1 != (int)lVar40);
  }
LAB_00157bc7:
  local_1a4 = iVar47;
  if ((MemPage **)local_188._16_8_ != (MemPage **)0x0) {
    sqlite3_free((void *)local_188._16_8_);
  }
  uVar60 = 0;
  do {
    if (local_58[uVar60] != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_58[uVar60]->pDbPage);
    }
    uVar60 = uVar60 + 1;
  } while (uVar28 != uVar60);
  iVar27 = local_1a4;
  if (0 < (int)uVar50) {
    uVar60 = 0;
    do {
      if (local_88[uVar60] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_88[uVar60]->pDbPage);
      }
      uVar60 = uVar60 + 1;
      iVar27 = local_1a4;
    } while (uVar50 != uVar60);
  }
LAB_00157c3e:
  if (local_1e8 != (void *)0x0) {
    pcache1Free(local_1e8);
  }
LAB_00157c60:
  local_1e8 = pvVar33;
  pPage->nOverflow = '\0';
  if (pPage != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pPage->pDbPage);
  }
  cVar22 = pCur->iPage + -1;
  pCur->iPage = cVar22;
  pCur->pPage = pCur->apPage[cVar22];
LAB_00157c90:
  bVar63 = true;
LAB_00157c92:
  if ((!bVar63) || (iVar27 != 0)) {
    if (local_1e8 != (void *)0x0) {
      pcache1Free(local_1e8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar27;
    }
    __stack_chk_fail();
  }
  goto LAB_00156ba9;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( sqlite3PagerPageRefcount(pPage->pDbPage)>1 ){
      /* The page being written is not a root page, and there is currently
      ** more than one reference to it. This only happens if the page is one
      ** of its own ancestor pages. Corruption. */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}